

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O1

int Wildcard::asterisk(char **wildcard,char **test)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  
  pcVar4 = *wildcard + 1;
  *wildcard = pcVar4;
  pcVar6 = *test;
  while (*pcVar6 != '\0') {
    if (*pcVar4 != '*') {
      if (*pcVar4 != '?') break;
      *test = pcVar6 + 1;
    }
    pcVar4 = *wildcard + 1;
    *wildcard = pcVar4;
    pcVar6 = *test;
  }
  pcVar6 = *wildcard;
  cVar1 = *pcVar6;
  while (cVar1 == '*') {
    pcVar6 = pcVar6 + 1;
    *wildcard = pcVar6;
    cVar1 = *pcVar6;
  }
  cVar2 = **test;
  iVar5 = 0;
  if (cVar1 == '\0' || cVar2 != '\0') {
    if (cVar2 == '\0' && cVar1 == '\0') {
      iVar5 = 1;
    }
    else {
      iVar3 = wildcardfit(pcVar6,*test);
      iVar5 = 1;
      while (iVar3 == 0) {
        pcVar6 = *test;
        do {
          pcVar6 = pcVar6 + 1;
          *test = pcVar6;
          cVar1 = *pcVar6;
          if ((cVar1 == '\0') || (cVar2 = **wildcard, cVar2 == '[')) break;
        } while (cVar2 != cVar1);
        if (cVar1 == '\0') {
          iVar5 = 0;
          break;
        }
        iVar3 = wildcardfit(*wildcard,pcVar6);
      }
      if ((**test == '\0') && (**wildcard == '\0')) {
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int Wildcard::asterisk(const char** wildcard, const char** test) {
  /* Warning: uses multiple returns */
  int fit = 1;

  /* erase the leading asterisk */
  (*wildcard)++;
  while (('\000' != (**test)) && (('?' == **wildcard) || ('*' == **wildcard))) {
    if ('?' == **wildcard) (*test)++;
    (*wildcard)++;
  }
  /* Now it could be that test is empty and wildcard contains */
  /* aterisks. Then we delete them to get a proper state */
  while ('*' == (**wildcard))
    (*wildcard)++;

  if (('\0' == (**test)) && ('\0' != (**wildcard))) return (fit = 0);
  if (('\0' == (**test)) && ('\0' == (**wildcard)))
    return (fit = 1);
  else {
    /* Neither test nor wildcard are empty!          */
    /* the first character of wildcard isn't in [*?] */
    if (0 == wildcardfit(*wildcard, (*test))) {
      do {
        (*test)++;
        /* skip as much characters as possible in the teststring */
        /* stop if a character match occurs */
        while (((**wildcard) != (**test)) && ('[' != (**wildcard)) &&
               ('\0' != (**test)))
          (*test)++;
      } while ((('\0' != **test)) ? (0 == wildcardfit(*wildcard, (*test))) :
                                    (0 != (fit = 0)));
    }
    if (('\0' == **test) && ('\0' == **wildcard)) fit = 1;
    return (fit);
  }
}